

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

statement_base * __thiscall
cs::method_foreach::translate
          (method_foreach *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  ulong uVar1;
  token_base *ptVar2;
  element_type *peVar3;
  _func_int **pp_Var4;
  _Elt_pointer pdVar5;
  int iVar6;
  const_reference pptVar7;
  token_base **pptVar8;
  statement_foreach *this_00;
  undefined4 extraout_var;
  _Elt_pointer pptVar9;
  long lVar10;
  ulong uVar11;
  context_t *context_00;
  long lVar12;
  _Self __tmp;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  allocator_type local_191;
  tree_type<cs::token_base_*> local_190;
  context_t local_188;
  string local_178;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_158;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_138;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_e8;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_98;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_48;
  
  pptVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  local_138._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(*pptVar7)[1]._vptr_token_base;
  pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_138);
  ptVar2 = *pptVar8;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            (&local_138,0);
  peVar3 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_158._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_158._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_158._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_158._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar12 = (long)local_158._M_cur - (long)local_158._M_first;
  lVar10 = lVar12 >> 4;
  uVar1 = lVar10 * -0x3333333333333333 + 1;
  if (lVar12 < -0x9f) {
    uVar11 = ~((lVar10 * 0x3333333333333333 - 2U) / 6);
  }
  else {
    if (uVar1 < 6) {
      local_158._M_cur = local_158._M_cur + 1;
      goto LAB_00286a10;
    }
    uVar11 = uVar1 / 6;
  }
  local_158._M_node = local_158._M_node + uVar11;
  local_158._M_first = *local_158._M_node;
  local_158._M_last = local_158._M_first + 6;
  local_158._M_cur = local_158._M_first + uVar11 * -6 + uVar1;
LAB_00286a10:
  local_48._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_48._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_48._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_48._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)&local_98,&local_158,&local_48,&local_191);
  context_00 = &peVar3->context;
  translator_type::translate
            (&peVar3->translator,context_00,&local_98,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_138,false)
  ;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque(&local_98);
  this_00 = (statement_foreach *)
            statement_base::operator_new((statement_base *)0x98,(size_t)context_00);
  pp_Var4 = ptVar2[3]._vptr_token_base;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pp_Var4,ptVar2[3].line_num + (long)pp_Var4);
  pptVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,3);
  iVar6 = tree_type<cs::token_base_*>::copy
                    ((EVP_PKEY_CTX *)(*pptVar7)[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
  local_190.mRoot = (tree_node *)CONCAT44(extraout_var,iVar6);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_e8,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_138);
  local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  pdVar5 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar9 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar9 ==
      (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar9 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  statement_foreach::statement_foreach
            (this_00,&local_178,&local_190,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_e8,
             &local_188,pptVar9[-1]);
  if (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_e8);
  tree_type<cs::token_base_*>::destroy(local_190.mRoot);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_138);
  return &this_00->super_statement_base;
}

Assistant:

statement_base *
	method_foreach::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		const std::string &it = static_cast<token_id *>(t.root().data())->get_id();
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		return new statement_foreach(it, static_cast<token_expr *>(raw.front().at(3))->get_tree(), body, context,
		                             raw.front().back());
	}